

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::SourceCodeInfo_Location::SerializeWithCachedSizesToArray
          (SourceCodeInfo_Location *this,uint8 *target)

{
  string *psVar1;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar2;
  int32 iVar3;
  uint uVar4;
  uint8 *puVar5;
  int i;
  int iVar6;
  
  if (0 < (this->path_).current_size_) {
    *target = '\n';
    target = io::CodedOutputStream::WriteVarint32ToArray(this->_path_cached_byte_size_,target + 1);
  }
  for (iVar6 = 0; iVar6 < (this->path_).current_size_; iVar6 = iVar6 + 1) {
    iVar3 = path(this,iVar6);
    target = io::CodedOutputStream::WriteVarint32SignExtendedToArray(iVar3,target);
  }
  if (0 < (this->span_).current_size_) {
    *target = '\x12';
    target = io::CodedOutputStream::WriteVarint32ToArray(this->_span_cached_byte_size_,target + 1);
  }
  for (iVar6 = 0; iVar6 < (this->span_).current_size_; iVar6 = iVar6 + 1) {
    iVar3 = span(this,iVar6);
    target = io::CodedOutputStream::WriteVarint32SignExtendedToArray(iVar3,target);
  }
  uVar4 = this->_has_bits_[0];
  if ((uVar4 & 4) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->leading_comments_->_M_dataplus)._M_p,
               (int)this->leading_comments_->_M_string_length,SERIALIZE);
    psVar1 = this->leading_comments_;
    *target = '\x1a';
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray
                       ((uint32)psVar1->_M_string_length,target + 1);
    target = io::CodedOutputStream::WriteStringToArray(psVar1,puVar5);
    uVar4 = this->_has_bits_[0];
  }
  if ((uVar4 & 8) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->trailing_comments_->_M_dataplus)._M_p,
               (int)this->trailing_comments_->_M_string_length,SERIALIZE);
    psVar1 = this->trailing_comments_;
    *target = '\"';
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray
                       ((uint32)psVar1->_M_string_length,target + 1);
    target = io::CodedOutputStream::WriteStringToArray(psVar1,puVar5);
  }
  pvVar2 = (this->_unknown_fields_).fields_;
  if ((pvVar2 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    puVar5 = internal::WireFormat::SerializeUnknownFieldsToArray(&this->_unknown_fields_,target);
    return puVar5;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* SourceCodeInfo_Location::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // repeated int32 path = 1 [packed = true];
  if (this->path_size() > 0) {
    target = ::google::protobuf::internal::WireFormatLite::WriteTagToArray(
      1,
      ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED,
      target);
    target = ::google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(
      _path_cached_byte_size_, target);
  }
  for (int i = 0; i < this->path_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteInt32NoTagToArray(this->path(i), target);
  }

  // repeated int32 span = 2 [packed = true];
  if (this->span_size() > 0) {
    target = ::google::protobuf::internal::WireFormatLite::WriteTagToArray(
      2,
      ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED,
      target);
    target = ::google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(
      _span_cached_byte_size_, target);
  }
  for (int i = 0; i < this->span_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteInt32NoTagToArray(this->span(i), target);
  }

  // optional string leading_comments = 3;
  if (has_leading_comments()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->leading_comments().data(), this->leading_comments().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        3, this->leading_comments(), target);
  }

  // optional string trailing_comments = 4;
  if (has_trailing_comments()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->trailing_comments().data(), this->trailing_comments().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        4, this->trailing_comments(), target);
  }

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}